

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void feat_lore(wchar_t oid)

{
  feature *pfVar1;
  textblock *tb_00;
  char *buf;
  char *title;
  textblock *tb;
  feature *feat;
  wchar_t oid_local;
  
  pfVar1 = f_info + oid;
  if (pfVar1->desc != (char *)0x0) {
    tb_00 = textblock_new();
    buf = string_make(pfVar1->name);
    my_strcap(buf);
    textblock_append_c(tb_00,'\x0e',"%s",buf);
    string_free(buf);
    textblock_append(tb_00,"\n");
    textblock_append(tb_00,"%s",pfVar1->desc);
    textblock_append(tb_00,"\n");
    textui_textblock_show(tb_00,(region_conflict)ZEXT816((ulong)0),(char *)0x0);
    textblock_free(tb_00);
  }
  return;
}

Assistant:

static void feat_lore(int oid)
{
	struct feature *feat = &f_info[oid];

	if (feat->desc) {
		textblock *tb = textblock_new();
		char *title = string_make(feat->name);

		my_strcap(title);
		textblock_append_c(tb, COLOUR_L_BLUE, "%s", title);
		string_free(title);
		textblock_append(tb, "\n");
		textblock_append(tb, "%s", feat->desc);
		textblock_append(tb, "\n");
		textui_textblock_show(tb, SCREEN_REGION, NULL);
		textblock_free(tb);
	}
}